

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

int Ivy_ManPropagateBuffers(Ivy_Man_t *p,int fUpdateLevel)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int nSteps;
  int NodeBeg;
  int LimitFactor;
  Ivy_Obj_t *pNode;
  int fUpdateLevel_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_ManNodeNum(p);
  local_2c = 0;
  do {
    iVar2 = Vec_PtrSize(p->vBufs);
    if (iVar2 < 1) {
      return local_2c;
    }
    _NodeBeg = (Ivy_Obj_t *)Vec_PtrEntryLast(p->vBufs);
    while (iVar2 = Ivy_ObjIsBuf(_NodeBeg), iVar2 != 0) {
      _NodeBeg = Ivy_ObjReadFirstFanout(p,_NodeBeg);
    }
    iVar2 = Ivy_ManLatchIsSelfFeed(_NodeBeg);
    if (iVar2 == 0) {
      Ivy_NodeFixBufferFanins(p,_NodeBeg,fUpdateLevel);
      if (iVar1 * 100 < local_2c) {
        printf("Structural hashing is not finished after %d forward latch moves.\n",
               (ulong)(uint)(iVar1 * 100));
        printf("This circuit cannot be forward-retimed completely. Quitting.\n");
        return local_2c;
      }
    }
    else {
      Vec_PtrPop(p->vBufs);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Ivy_ManPropagateBuffers( Ivy_Man_t * p, int fUpdateLevel )
{
    Ivy_Obj_t * pNode;
    int LimitFactor = 100;
    int NodeBeg = Ivy_ManNodeNum(p);
    int nSteps;
    for ( nSteps = 0; Vec_PtrSize(p->vBufs) > 0; nSteps++ )
    {
        pNode = (Ivy_Obj_t *)Vec_PtrEntryLast(p->vBufs);
        while ( Ivy_ObjIsBuf(pNode) )
            pNode = Ivy_ObjReadFirstFanout( p, pNode );
        // check if this buffer should remain
        if ( Ivy_ManLatchIsSelfFeed(pNode) )
        {
            Vec_PtrPop(p->vBufs);
            continue;
        }
//printf( "Propagating buffer %d with input %d and output %d\n", Ivy_ObjFaninId0(pNode), Ivy_ObjFaninId0(Ivy_ObjFanin0(pNode)), pNode->Id );
//printf( "Latch num %d\n", Ivy_ManLatchNum(p) );
        Ivy_NodeFixBufferFanins( p, pNode, fUpdateLevel );
        if ( nSteps > NodeBeg * LimitFactor )
        {
            printf( "Structural hashing is not finished after %d forward latch moves.\n", NodeBeg * LimitFactor );
            printf( "This circuit cannot be forward-retimed completely. Quitting.\n" );
            break;
        }
    }
//    printf( "Number of steps = %d. Nodes beg = %d. Nodes end = %d.\n", nSteps, NodeBeg, Ivy_ManNodeNum(p) );
    return nSteps;
}